

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O2

char * curl_mvaprintf(char *format,__va_list_tag *ap_save)

{
  int iVar1;
  char *local_28;
  undefined4 local_20;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  undefined4 uStack_14;
  int iStack_10;
  
  uStack_18 = 0;
  uStack_14 = 0;
  iStack_10 = 0;
  local_28 = (char *)0x0;
  local_20 = 0;
  uStack_1c = 0;
  iVar1 = dprintf_formatf(&local_28,alloc_addbyter,format,ap_save);
  if ((iVar1 == -1) || (iStack_10 != 0)) {
    if (CONCAT44(uStack_14,uStack_18) != 0) {
      (*Curl_cfree)(local_28);
    }
    local_28 = (char *)0x0;
  }
  else if (CONCAT44(uStack_14,uStack_18) == 0) {
    local_28 = (*Curl_cstrdup)("");
  }
  else {
    local_28[CONCAT44(uStack_1c,local_20)] = '\0';
  }
  return local_28;
}

Assistant:

char *curl_mvaprintf(const char *format, va_list ap_save)
{
  int retcode;
  struct asprintf info;

  info.buffer = NULL;
  info.len = 0;
  info.alloc = 0;
  info.fail = 0;

  retcode = dprintf_formatf(&info, alloc_addbyter, format, ap_save);
  if((-1 == retcode) || info.fail) {
    if(info.alloc)
      free(info.buffer);
    return NULL;
  }

  if(info.alloc) {
    info.buffer[info.len] = 0; /* we terminate this with a zero byte */
    return info.buffer;
  }
  else
    return strdup("");
}